

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::MemoryDataParameter::MemoryDataParameter(MemoryDataParameter *this,MemoryDataParameter *from)

{
  void *pvVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MemoryDataParameter_006fa100;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar2 = from->channels_;
  uVar3 = from->height_;
  uVar4 = from->width_;
  this->batch_size_ = from->batch_size_;
  this->channels_ = uVar2;
  this->height_ = uVar3;
  this->width_ = uVar4;
  return;
}

Assistant:

MemoryDataParameter::MemoryDataParameter(const MemoryDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&width_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(width_));
  // @@protoc_insertion_point(copy_constructor:caffe.MemoryDataParameter)
}